

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::UnitTestOptions::GetOutputFormat_abi_cxx11_(void)

{
  char *pcVar1;
  ulong uVar2;
  string *in_RDI;
  char *colon;
  char *gtest_output_flag;
  string s;
  string *__s;
  undefined2 in_stack_ffffffffffffffb0;
  byte bVar3;
  undefined5 in_stack_ffffffffffffffb3;
  bool local_3a;
  allocator<char> local_39;
  char *local_38;
  char *local_30;
  string local_28 [40];
  
  __s = in_RDI;
  std::__cxx11::string::string(local_28,(string *)FLAGS_gtest_output_abi_cxx11_);
  local_30 = (char *)std::__cxx11::string::c_str();
  local_38 = strchr(local_30,0x3a);
  pcVar1 = local_30;
  bVar3 = 0;
  local_3a = local_38 != (char *)0x0;
  if (local_3a) {
    uVar2 = (long)local_38 - (long)local_30;
    std::allocator<char>::allocator();
    bVar3 = 1;
    std::__cxx11::string::string
              ((string *)in_RDI,pcVar1,uVar2,(allocator *)&stack0xffffffffffffffb3);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT53(in_stack_ffffffffffffffb3,CONCAT12(bVar3,in_stack_ffffffffffffffb0)),
               (char *)__s,(allocator<char> *)in_RDI);
  }
  local_3a = !local_3a;
  if ((bVar3 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb3);
  }
  if (local_3a) {
    std::allocator<char>::~allocator(&local_39);
  }
  std::__cxx11::string::~string(local_28);
  return __s;
}

Assistant:

std::string UnitTestOptions::GetOutputFormat() {
  std::string s = GTEST_FLAG_GET(output);
  const char* const gtest_output_flag = s.c_str();
  const char* const colon = strchr(gtest_output_flag, ':');
  return (colon == nullptr)
             ? std::string(gtest_output_flag)
             : std::string(gtest_output_flag,
                           static_cast<size_t>(colon - gtest_output_flag));
}